

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflectance.cpp
# Opt level: O3

Spectrum * __thiscall
phyr::MicrofacetReflection::f
          (Spectrum *__return_storage_ptr__,MicrofacetReflection *this,Vector3f *wo,Vector3f *wi)

{
  double *pdVar1;
  double dVar2;
  long lVar3;
  double dVar4;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  undefined1 auVar5 [16];
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  CoefficientSpectrum<60> cs;
  CoefficientSpectrum<60> cs_1;
  CoefficientSpectrum<60> cs_2;
  CoefficientSpectrum<60> cs_3;
  Spectrum F;
  double local_988 [120];
  double local_5c8 [60];
  undefined1 local_3e8 [480];
  double local_208 [60];
  
  dVar6 = wo->z;
  if ((dVar6 != 0.0) || (NAN(dVar6))) {
    dVar2 = wi->z;
    if ((dVar2 != 0.0) || (NAN(dVar2))) {
      dVar7 = wo->x + wi->x;
      dVar8 = wo->y + wi->y;
      dVar4 = dVar6 + dVar2;
      if ((((dVar4 != 0.0) || (NAN(dVar4))) || (dVar7 != 0.0)) ||
         (((NAN(dVar7) || (dVar8 != 0.0)) || (NAN(dVar8))))) {
        dVar9 = 1.0 / SQRT(dVar4 * dVar4 + dVar7 * dVar7 + dVar8 * dVar8);
        (**this->fresnel->_vptr_Fresnel)
                  (dVar4 * dVar9 * dVar2 + dVar7 * dVar9 * wi->x + wi->y * dVar8 * dVar9,local_208);
        (*this->distribution->_vptr_MicrofacetDistribution[2])();
        lVar3 = 0;
        memset(local_988,0,0x1e0);
        do {
          pdVar1 = (this->R).super_CoefficientSpectrum<60>.samples + lVar3;
          dVar4 = pdVar1[1];
          local_988[lVar3] = *pdVar1 * extraout_XMM0_Qa;
          local_988[lVar3 + 1] = dVar4 * extraout_XMM0_Qa;
          lVar3 = lVar3 + 2;
        } while (lVar3 != 0x3c);
        (*this->distribution->_vptr_MicrofacetDistribution[4])(this->distribution,wo,wi);
        lVar3 = 0;
        memset(local_988 + 0x3c,0,0x1e0);
        do {
          local_988[lVar3 + 0x3c] = local_988[lVar3] * extraout_XMM0_Qa_00;
          local_988[lVar3 + 0x3d] = local_988[lVar3 + 1] * extraout_XMM0_Qa_00;
          lVar3 = lVar3 + 2;
        } while (lVar3 != 0x3c);
        lVar3 = 0;
        memset(local_5c8,0,0x1e0);
        do {
          dVar4 = local_988[lVar3 + 0x3d];
          dVar7 = local_208[lVar3 + 1];
          local_5c8[lVar3] = local_208[lVar3] * local_988[lVar3 + 0x3c];
          local_5c8[lVar3 + 1] = dVar7 * dVar4;
          lVar3 = lVar3 + 2;
        } while (lVar3 != 0x3c);
        lVar3 = 0;
        memset(local_3e8,0,0x1e0);
        dVar6 = ABS(dVar6) * ABS(dVar2) * 4.0;
        do {
          auVar5._8_8_ = dVar6;
          auVar5._0_8_ = dVar6;
          auVar5 = divpd(*(undefined1 (*) [16])(local_5c8 + lVar3),auVar5);
          *(undefined1 (*) [16])(local_3e8 + lVar3 * 8) = auVar5;
          lVar3 = lVar3 + 2;
        } while (lVar3 != 0x3c);
        memcpy(__return_storage_ptr__,local_3e8,0x1e0);
        return __return_storage_ptr__;
      }
    }
  }
  memset(__return_storage_ptr__,0,0x1e0);
  return __return_storage_ptr__;
}

Assistant:

Spectrum MicrofacetReflection::f(const Vector3f& wo, const Vector3f& wi) const {
    Real cosThetaO = absCosTheta(wo), cosThetaI = absCosTheta(wi);
    Vector3f wh = wi + wo;

    // Handle degenerate cases for microfacet reflection
    if (cosThetaI == 0 || cosThetaO == 0) return Spectrum(0.);
    if (wh.x == 0 && wh.y == 0 && wh.z == 0) return Spectrum(0.);
    wh = normalize(wh);
    Spectrum F = fresnel->evaluate(dot(wi, wh));

    return R * distribution->d(wh) * distribution->g(wo, wi) * F / (4 * cosThetaI * cosThetaO);
}